

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

Vec_Int_t * Llb_ManMarkPivotNodes(Aig_Man_t *p,int fUseInternal)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Vec_Int_t *p_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVar2Obj;
  int fUseInternal_local;
  Aig_Man_t *p_local;
  
  for (local_2c = 0; iVar2 = Vec_PtrSize(p->vCis), local_2c < iVar2; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,local_2c);
    *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef | 0x10;
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pvVar3 = Vec_PtrEntry(pVVar1,local_2c + iVar2);
    *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef | 0x10;
  }
  if (fUseInternal != 0) {
    Llb_ManMarkInternalPivots(p);
  }
  pAVar4 = Aig_ManConst1(p);
  *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef;
  p_00 = Vec_IntAlloc(100);
  for (local_2c = 0; iVar2 = Vec_PtrSize(p->vCis), local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_2c);
    iVar2 = Aig_ObjId(pAVar4);
    Vec_IntPush(p_00,iVar2);
  }
  for (local_2c = 0; iVar2 = Vec_PtrSize(p->vObjs), local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) &&
       ((*(ulong *)&pAVar4->field_0x18 >> 4 & 1) != 0)) {
      iVar2 = Aig_ObjId(pAVar4);
      Vec_IntPush(p_00,iVar2);
    }
  }
  for (local_2c = 0; iVar2 = Saig_ManRegNum(p), local_2c < iVar2; local_2c = local_2c + 1) {
    pVVar1 = p->vCos;
    iVar2 = Saig_ManPoNum(p);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_2c + iVar2);
    iVar2 = Aig_ObjId(pAVar4);
    Vec_IntPush(p_00,iVar2);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_ManMarkPivotNodes( Aig_Man_t * p, int fUseInternal )
{
    Vec_Int_t * vVar2Obj;
    Aig_Obj_t * pObj;
    int i;
    // mark inputs/outputs
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = 1;
    Saig_ManForEachLi( p, pObj, i )
        pObj->fMarkA = 1;

    // mark internal pivot nodes
    if ( fUseInternal )
        Llb_ManMarkInternalPivots( p );

    // assign variable numbers
    Aig_ManConst1(p)->fMarkA = 0;
    vVar2Obj = Vec_IntAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntPush( vVar2Obj, Aig_ObjId(pObj) );
    return vVar2Obj;
}